

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O3

Symbol * sym_FindScopedSymbol(char *symName)

{
  char *pcVar1;
  char *pcVar2;
  Symbol *pSVar3;
  char *in_RCX;
  char fullName [256];
  char acStack_118 [264];
  
  pcVar1 = strchr(symName,0x2e);
  if (pcVar1 != (char *)0x0) {
    pcVar2 = strchr(pcVar1 + 1,0x2e);
    if (pcVar2 != (char *)0x0) {
      fatalerror("\'%s\' is a nonsensical reference to a nested local symbol\n",symName);
    }
    if (pcVar1 == symName) {
      fullSymbolName(acStack_118,(size_t)symName,labelScope,in_RCX);
      pSVar3 = (Symbol *)hash_GetElement(symbols,acStack_118);
      return pSVar3;
    }
  }
  pSVar3 = (Symbol *)hash_GetElement(symbols,symName);
  return pSVar3;
}

Assistant:

struct Symbol *sym_FindScopedSymbol(char const *symName)
{
	char const *localName = strchr(symName, '.');

	if (localName) {
		if (strchr(localName + 1, '.'))
			fatalerror("'%s' is a nonsensical reference to a nested local symbol\n",
				   symName);
		// If auto-scoped local label, expand the name
		if (localName == symName) { // Meaning, the name begins with the dot
			char fullName[MAXSYMLEN + 1];

			fullSymbolName(fullName, sizeof(fullName), symName, labelScope);
			return sym_FindExactSymbol(fullName);
		}
	}
	return sym_FindExactSymbol(symName);
}